

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

void __thiscall
glslang::TReflectionTraverser::addPipeIOVariable(TReflectionTraverser *this,TIntermSymbol *base)

{
  _Rb_tree_header *p_Var1;
  EShLanguageMask *pEVar2;
  TReflection *pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  TMapIndexToReflection *this_00;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  TType *type;
  undefined4 extraout_var_01;
  iterator iVar10;
  undefined4 extraout_var_02;
  mapped_type *pmVar11;
  undefined4 extraout_var_03;
  uint uVar12;
  _Base_ptr p_Var13;
  TMapIndexToReflection *pTVar14;
  _Base_ptr p_Var15;
  size_type sVar16;
  void *__child_stack;
  pointer pcVar17;
  TPoolAllocator *__fn;
  void *in_R8;
  bool input;
  TNameToIndex *this_02;
  TString baseName;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_f8;
  undefined1 local_f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  int local_a0;
  int local_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  char *local_88;
  TType *local_80;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_01;
  undefined4 extraout_var_00;
  
  p_Var1 = &(this->processedDerefs)._M_t._M_impl.super__Rb_tree_header;
  p_Var15 = (this->processedDerefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var13 = &p_Var1->_M_header;
  for (; p_Var15 != (_Base_ptr)0x0;
      p_Var15 = (&p_Var15->_M_left)[*(TIntermSymbol **)(p_Var15 + 1) < base]) {
    if (*(TIntermSymbol **)(p_Var15 + 1) >= base) {
      p_Var13 = p_Var15;
    }
  }
  p_Var15 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
     (p_Var15 = p_Var13, base < *(TIntermSymbol **)(p_Var13 + 1))) {
    p_Var15 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var15 != p_Var1) {
    return;
  }
  local_c8._0_8_ = base;
  std::
  _Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
  ::_M_insert_unique<TIntermNode_const*>
            ((_Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
              *)&this->processedDerefs,(TIntermNode **)local_c8);
  iVar6 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(base);
  this_01 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
            CONCAT44(extraout_var,iVar6);
  iVar6 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
  type = (TType *)CONCAT44(extraout_var_00,iVar6);
  iVar6 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(base);
  uVar12 = *(uint *)(CONCAT44(extraout_var_01,iVar6) + 8) & 0x7f;
  input = (bool)((byte)(0xe300008 >> ((byte)uVar12 & 0x1f)) & uVar12 < 0x1c);
  pTVar3 = this->reflection;
  pTVar14 = &pTVar3->indexToPipeInput;
  this_02 = &pTVar3->pipeInNameToIndex;
  this_00 = pTVar14;
  if (input == false) {
    this_02 = &pTVar3->pipeOutNameToIndex;
    this_00 = &pTVar3->indexToPipeOutput;
  }
  if ((pTVar3->options & EShReflectionUnwrapIOBlocks) == EShReflectionDefault) {
    local_f8 = this_01;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(this_01->_M_dataplus)._M_p,(allocator<char> *)local_f0);
    iVar6 = (int)pTVar14;
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&this_02->_M_t,(key_type *)local_c8);
    if ((TIntermSymbol *)local_c8._0_8_ != (TIntermSymbol *)local_b8) {
      operator_delete((void *)local_c8._0_8_,local_b8._0_8_ + 1);
    }
    if ((_Rb_tree_header *)iVar10._M_node != &(this_02->_M_t)._M_impl.super__Rb_tree_header) {
      pEVar2 = &(this_00->
                super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                )._M_impl.super__Vector_impl_data._M_start[(int)iVar10._M_node[2]._M_color].stages;
      *pEVar2 = *pEVar2 | 1 << ((char)this->intermediate->language & 0x1f);
      return;
    }
    pTVar4 = (this_00->
             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pTVar5 = (this_00->
             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(local_f8->_M_dataplus)._M_p,(allocator<char> *)local_f0);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[](this_02,(key_type *)local_c8);
    *pmVar11 = (int)((ulong)((long)pTVar4 - (long)pTVar5) >> 4) * -0x33333333;
    if ((TIntermSymbol *)local_c8._0_8_ != (TIntermSymbol *)local_b8) {
      operator_delete((void *)local_c8._0_8_,local_b8._0_8_ + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,(local_f8->_M_dataplus)._M_p,&local_f9);
    iVar7 = mapToGlType(this,type);
    iVar8 = (*type->_vptr_TType[0x1d])(type);
    iVar9 = 1;
    if ((char)iVar8 != '\0') {
      iVar9 = (*type->_vptr_TType[0xf])(type);
    }
    local_c8._0_8_ = local_b8;
    __fn = (TPoolAllocator *)local_f0._0_8_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_f0._0_8_,(pointer)(local_f0._8_8_ + local_f0._0_8_));
    local_b8._16_4_ = 0;
    local_9c = 0;
    iStack_98 = -1;
    iStack_94 = -1;
    iStack_90 = 0;
    local_88 = (char *)0x0;
    local_b8._20_4_ = iVar7;
    local_a0 = iVar9;
    iVar6 = TType::clone(type,(__fn *)__fn,__child_stack,iVar6,in_R8);
    local_80 = (TType *)CONCAT44(extraout_var_03,iVar6);
    std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
    emplace_back<glslang::TObjectReflection>(this_00,(TObjectReflection *)local_c8);
    if ((TIntermNode *)local_c8._0_8_ != (TIntermNode *)local_b8) {
      operator_delete((void *)local_c8._0_8_,local_b8._0_8_ + 1);
    }
    if ((TPoolAllocator *)local_f0._0_8_ != (TPoolAllocator *)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    pEVar2 = &(this_00->
              super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
              )._M_impl.super__Vector_impl_data._M_finish[-1].stages;
    *pEVar2 = *pEVar2 | 1 << ((char)this->intermediate->language & 0x1f);
    return;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(this_01,0,5,"anon@");
  local_f0._0_8_ = GetThreadPoolAllocator();
  local_f0._16_8_ = 0;
  local_d8._M_local_buf[0] = '\0';
  local_f0._8_8_ = &local_d8;
  iVar7 = (*type->_vptr_TType[7])(type);
  if (iVar7 == 0x10) {
    if (iVar6 == 0) {
      local_c8._0_8_ = GetThreadPoolAllocator();
      local_b8._0_8_ = 0;
      local_b8[8] = '\0';
      local_c8._8_8_ = local_b8 + 8;
      goto LAB_00376b91;
    }
    iVar6 = (*type->_vptr_TType[5])(type);
    local_c8._0_8_ = GetThreadPoolAllocator();
    pcVar17 = *(pointer *)(CONCAT44(extraout_var_02,iVar6) + 8);
    sVar16 = *(size_type *)(CONCAT44(extraout_var_02,iVar6) + 0x10);
  }
  else {
    local_c8._0_8_ = GetThreadPoolAllocator();
    local_c8._8_8_ = local_b8 + 8;
    if (iVar6 == 0) {
      local_b8._0_8_ = 0;
      local_b8[8] = '\0';
      goto LAB_00376b91;
    }
    pcVar17 = (this_01->_M_dataplus)._M_p;
    sVar16 = this_01->_M_string_length;
  }
  local_c8._8_8_ = local_b8 + 8;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                      local_c8,pcVar17,pcVar17 + sVar16);
LAB_00376b91:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_f0,
            (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_c8);
  iVar6 = (*type->_vptr_TType[0x1d])(type);
  if (((char)iVar6 != '\0') && (iVar6 = (*type->_vptr_TType[7])(type), iVar6 == 0x10)) {
    TType::TType((TType *)local_c8,type,0,false);
    type = (TType *)local_c8;
  }
  blowUpIOAggregate(this,input,(TString *)local_f0,type);
  return;
}

Assistant:

void addPipeIOVariable(const TIntermSymbol& base)
    {
        if (processedDerefs.find(&base) == processedDerefs.end()) {
            processedDerefs.insert(&base);

            const TString &name = base.getName();
            const TType &type = base.getType();
            const bool input = base.getQualifier().isPipeInput();

            TReflection::TMapIndexToReflection &ioItems =
                input ? reflection.indexToPipeInput : reflection.indexToPipeOutput;


            TReflection::TNameToIndex &ioMapper =
                input ? reflection.pipeInNameToIndex : reflection.pipeOutNameToIndex;

            if (reflection.options & EShReflectionUnwrapIOBlocks) {
                bool anonymous = IsAnonymous(name);

                TString baseName;
                if (type.getBasicType() == EbtBlock) {
                    baseName = anonymous ? TString() : type.getTypeName();
                } else {
                    baseName = anonymous ? TString() : name;
                }

                // by convention if this is an arrayed block we ignore the array in the reflection
                if (type.isArray() && type.getBasicType() == EbtBlock) {
                    blowUpIOAggregate(input, baseName, TType(type, 0));
                } else {               
                    blowUpIOAggregate(input, baseName, type);
                }
            } else {
                TReflection::TNameToIndex::const_iterator it = ioMapper.find(name.c_str());
                if (it == ioMapper.end()) {
                    // seperate pipe i/o params from uniforms and blocks
                    // in is only for input in first stage as out is only for last stage. check traverse in call stack.
                    ioMapper[name.c_str()] = static_cast<int>(ioItems.size());
                    ioItems.push_back(
                        TObjectReflection(name.c_str(), type, 0, mapToGlType(type), mapToGlArraySize(type), 0));
                    EShLanguageMask& stages = ioItems.back().stages;
                    stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
                } else {
                    EShLanguageMask& stages = ioItems[it->second].stages;
                    stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
                }
            }
        }
    }